

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

int Str_MuxRestructArea_rec
              (Gia_Man_t *pNew,Str_Mux_t *pTree,Str_Mux_t *pRoot,int i,Vec_Int_t *vDelay,
              int fVerbose)

{
  Str_Mux_t *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  Str_Mux_t *pRoot_00;
  bool bVar7;
  bool bVar8;
  int Path [4];
  int local_48;
  int local_44;
  int local_40;
  
  lVar6 = (long)pRoot->Edge[i].Fan;
  if (0 < lVar6) {
    pRoot_00 = pRoot + (lVar6 - pRoot->Id);
    iVar2 = Str_MuxRestructArea_rec(pNew,pTree,pRoot_00,0,vDelay,fVerbose);
    iVar3 = Str_MuxRestructArea_rec(pNew,pTree,pRoot_00,1,vDelay,fVerbose);
    iVar4 = iVar3 + iVar2;
    if (iVar4 < 2) {
      return iVar4 + 1;
    }
    if (iVar4 - 3U < 2) {
      iVar4 = CONCAT31((int3)((uint)iVar4 >> 8),iVar2 == 2);
      if (iVar3 != 2 && iVar2 != 2) {
        __assert_fail("nMuxes0 == 2 || nMuxes1 == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x714,
                      "int Str_MuxRestructArea_rec(Gia_Man_t *, Str_Mux_t *, Str_Mux_t *, int, Vec_Int_t *, int)"
                     );
      }
    }
    else {
      if (iVar4 != 2) {
        __assert_fail("nMuxes0 + nMuxes1 == 3 || nMuxes0 + nMuxes1 == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x713,
                      "int Str_MuxRestructArea_rec(Gia_Man_t *, Str_Mux_t *, Str_Mux_t *, int, Vec_Int_t *, int)"
                     );
      }
      if (iVar2 == 2 || iVar3 == 2) {
        iVar4 = pRoot_00->Id;
        lVar6 = (long)pRoot_00->Edge[iVar3 == 2].Fan;
        pSVar1 = pRoot_00 + (lVar6 - iVar4);
        lVar6 = (long)pRoot_00[lVar6 - iVar4].Edge[0].Fan;
        bVar8 = false;
        bVar7 = false;
        if (0 < lVar6) {
          bVar7 = pSVar1[lVar6 - pSVar1->Id].Copy != -2;
        }
        iVar2 = pSVar1->Edge[1].Fan;
        lVar6 = (long)iVar2;
        if (0 < lVar6) {
          bVar8 = pSVar1[lVar6 - pSVar1->Id].Copy != -2;
        }
        if (bVar7 == bVar8) {
          __assert_fail("Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x70a,
                        "int Str_MuxRestructArea_rec(Gia_Man_t *, Str_Mux_t *, Str_Mux_t *, int, Vec_Int_t *, int)"
                       );
        }
        if (((1 < (uint)i) || (pRoot->Id < 0)) || (local_40 = i + pRoot->Id * 2, iVar4 < 0)) {
LAB_007e8225:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        local_44 = (uint)(iVar3 == 2) + iVar4 * 2;
        iVar4 = pSVar1->Id;
        if (iVar2 < 1) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)(pSVar1[lVar6 - iVar4].Copy != -2);
        }
        if (iVar4 < 0) goto LAB_007e8225;
        local_48 = uVar5 + iVar4 * 2;
        Str_MuxChangeOnce(pTree,&local_48,0,2,(Str_Mux_t *)0x0,pNew,vDelay);
      }
      iVar4 = pRoot->Id * 0x40;
      pRoot_00 = pRoot + ((long)pRoot->Edge[i].Fan - (long)pRoot->Id);
    }
    Str_MuxRestructAreaThree(pNew,pRoot_00,vDelay,iVar4);
  }
  return 0;
}

Assistant:

int Str_MuxRestructArea_rec( Gia_Man_t * pNew, Str_Mux_t * pTree, Str_Mux_t * pRoot, int i, Vec_Int_t * vDelay, int fVerbose )
{
    int Path[4];
    int fSkipMoving = 1;
    Str_Mux_t * pMux, * pFanin0, * pFanin1;
    int nMuxes0, nMuxes1;
    if ( pRoot->Edge[i].Fan <= 0 )
        return 0;
    pMux    = Str_MuxFanin( pRoot, i );
    nMuxes0 = Str_MuxRestructArea_rec( pNew, pTree, pMux, 0, vDelay, fVerbose );
    nMuxes1 = Str_MuxRestructArea_rec( pNew, pTree, pMux, 1, vDelay, fVerbose );
    if ( nMuxes0 + nMuxes1 < 2 )
        return 1 + nMuxes0 + nMuxes1;
    if ( nMuxes0 + nMuxes1 == 2 )
    {
        if ( nMuxes0 == 2 || nMuxes1 == 2 )
        {
            pFanin0 = Str_MuxFanin( pMux, (int)(nMuxes1 == 2) );
            assert( Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1) );
            Path[2] = Abc_Var2Lit(pRoot->Id, i);
            Path[1] = Abc_Var2Lit(pMux->Id, (int)(nMuxes1 == 2) );
            Path[0] = Abc_Var2Lit(pFanin0->Id, Str_MuxHasFanin(pFanin0, 1));
            Str_MuxChangeOnce( pTree, Path, 0, 2, NULL, pNew, vDelay );
        }
        Str_MuxRestructAreaThree( pNew, Str_MuxFanin(pRoot, i), vDelay, fVerbose );
        return 0;
    }
    assert( nMuxes0 + nMuxes1 == 3 || nMuxes0 + nMuxes1 == 4 );
    assert( nMuxes0 == 2 || nMuxes1 == 2 );
    if ( fSkipMoving )
    {
        Str_MuxRestructAreaThree( pNew, pMux, vDelay, fVerbose );
        return 0;
    }
    if ( nMuxes0 == 2 )
    {
        pFanin0 = Str_MuxFanin( pMux, 0 );
        assert( Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1) );
        Path[3] = Abc_Var2Lit(pRoot->Id, i);
        Path[2] = Abc_Var2Lit(pMux->Id, 0 );
        Path[1] = Abc_Var2Lit(pFanin0->Id, Str_MuxHasFanin(pFanin0, 1));
        pFanin1 = Str_MuxFanin( pFanin0, Str_MuxHasFanin(pFanin0, 1) );
        assert( !Str_MuxHasFanin(pFanin1, 0) && !Str_MuxHasFanin(pFanin1, 1) );
        Path[0] = Abc_Var2Lit(pFanin1->Id, 0);
        Str_MuxChangeOnce( pTree, Path, 0, 3, NULL, pNew, vDelay );
    }
    if ( nMuxes1 == 2 )
    {
        pFanin0 = Str_MuxFanin( pMux, 1 );
        assert( Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1) );
        Path[3] = Abc_Var2Lit(pRoot->Id, i);
        Path[2] = Abc_Var2Lit(pMux->Id, 1 );
        Path[1] = Abc_Var2Lit(pFanin0->Id, Str_MuxHasFanin(pFanin0, 1));
        pFanin1 = Str_MuxFanin( pFanin0, Str_MuxHasFanin(pFanin0, 1) );
        assert( !Str_MuxHasFanin(pFanin1, 0) && !Str_MuxHasFanin(pFanin1, 1) );
        Path[0] = Abc_Var2Lit(pFanin1->Id, 0);
        Str_MuxChangeOnce( pTree, Path, 0, 3, NULL, pNew, vDelay );
    }
    Str_MuxRestructAreaThree( pNew, pMux, vDelay, fVerbose );
    return nMuxes0 + nMuxes1 - 2;
}